

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::setRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  int *in_RCX;
  int in_ESI;
  long in_RDI;
  SimpleString repeatParameter;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  *(undefined8 *)(in_RDI + 0x28) = 0;
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  sVar2 = SimpleString::size((SimpleString *)0x18bd73);
  if (sVar2 < 3) {
    if (*in_RCX + 1 < in_ESI) {
      iVar1 = SimpleString::AtoI((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
      *(long *)(in_RDI + 0x28) = (long)iVar1;
      if (*(long *)(in_RDI + 0x28) != 0) {
        *in_RCX = *in_RCX + 1;
      }
    }
  }
  else {
    iVar1 = SimpleString::AtoI((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              );
    *(long *)(in_RDI + 0x28) = (long)iVar1;
  }
  if (*(long *)(in_RDI + 0x28) == 0) {
    *(undefined8 *)(in_RDI + 0x28) = 2;
  }
  SimpleString::~SimpleString((SimpleString *)0x18be49);
  return;
}

Assistant:

void CommandLineArguments::setRepeatCount(int ac, const char *const *av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = (size_t) (SimpleString::AtoI(av[i] + 2));
    else if (i + 1 < ac) {
        repeat_ = (size_t) (SimpleString::AtoI(av[i + 1]));
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}